

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

int duckdb_brotli::SafeDecodeDistanceBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  HuffmanCode *pHVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  HuffmanCode *pHVar15;
  uint64_t uVar16;
  byte *pbVar17;
  bool bVar18;
  ulong local_40;
  ulong local_38;
  
  uVar3 = s->num_block_types[2];
  if (uVar3 < 2) {
LAB_01c06d5c:
    iVar8 = 0;
  }
  else {
    pHVar15 = s->block_type_trees;
    pHVar4 = s->block_len_trees;
    br = &s->br;
    uVar5 = (s->br).val_;
    uVar6 = (s->br).bit_pos_;
    pbVar7 = (s->br).next_in;
    pbVar11 = (s->br).last_in;
    uVar9 = uVar5;
    uVar10 = uVar6;
    uVar13 = uVar6;
    pbVar17 = pbVar7;
    if (uVar6 < 0xf) {
      do {
        if (pbVar17 == pbVar11) {
          iVar8 = SafeDecodeSymbol(pHVar15 + 0x4f0,br,&local_40);
          if (iVar8 == 0) goto LAB_01c06d5c;
          goto LAB_01c06b90;
        }
        uVar9 = uVar9 | (ulong)*pbVar17 << ((byte)uVar10 & 0x3f);
        (s->br).val_ = uVar9;
        uVar13 = uVar10 + 8;
        (s->br).bit_pos_ = uVar13;
        (s->br).next_in = pbVar17 + 1;
        bVar18 = uVar10 < 7;
        uVar10 = uVar13;
        pbVar17 = pbVar17 + 1;
      } while (bVar18);
    }
    pHVar15 = pHVar15 + 0x4f0 + (uVar9 & 0xff);
    uVar12 = (ulong)pHVar15->bits;
    uVar10 = uVar9;
    if (8 < uVar12) {
      uVar13 = uVar13 - 8;
      uVar10 = uVar9 >> 8;
      pHVar15 = pHVar15 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar15->bits - 8) * 8) &
                                  (uint)(uVar9 >> 8) & 0x7f) + (ulong)pHVar15->value;
      uVar12 = (ulong)pHVar15->bits;
    }
    (s->br).bit_pos_ = uVar13 - uVar12;
    (s->br).val_ = uVar10 >> ((byte)uVar12 & 0x3f);
    local_40 = (ulong)pHVar15->value;
LAB_01c06b90:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar13 = (s->br).bit_pos_;
      if (uVar13 < 0xf) {
        pbVar17 = (s->br).next_in;
        uVar10 = uVar13;
        do {
          if (pbVar17 == (s->br).last_in) {
            iVar8 = SafeDecodeSymbol(pHVar4 + 0x318,br,&local_38);
            if (iVar8 == 0) goto LAB_01c06d26;
            goto LAB_01c06c83;
          }
          uVar9 = (ulong)*pbVar17 << ((byte)uVar10 & 0x3f) | (s->br).val_;
          (s->br).val_ = uVar9;
          uVar13 = uVar10 + 8;
          (s->br).bit_pos_ = uVar13;
          pbVar17 = pbVar17 + 1;
          (s->br).next_in = pbVar17;
          bVar18 = uVar10 < 7;
          uVar10 = uVar13;
        } while (bVar18);
      }
      else {
        uVar9 = br->val_;
      }
      pHVar15 = pHVar4 + 0x318 + (uVar9 & 0xff);
      uVar12 = (ulong)pHVar15->bits;
      uVar10 = uVar9;
      if (8 < uVar12) {
        uVar13 = uVar13 - 8;
        uVar10 = uVar9 >> 8;
        pHVar15 = pHVar15 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar15->bits - 8) * 8) &
                                    (uint)(uVar9 >> 8) & 0x7f) + (ulong)pHVar15->value;
        uVar12 = (ulong)pHVar15->bits;
      }
      (s->br).bit_pos_ = uVar13 - uVar12;
      (s->br).val_ = uVar10 >> ((byte)uVar12 & 0x3f);
      local_38 = (ulong)pHVar15->value;
    }
    else {
      local_38 = s->block_length_index;
    }
LAB_01c06c83:
    bVar1 = _kBrotliPrefixCodeRanges[local_38 * 4 + 2];
    uVar9 = (ulong)bVar1;
    uVar2 = *(ushort *)(_kBrotliPrefixCodeRanges + local_38 * 4);
    uVar13 = (s->br).bit_pos_;
    if (uVar13 < uVar9) {
      pbVar17 = (s->br).next_in;
      do {
        if (pbVar17 == (s->br).last_in) {
          s->block_length_index = local_38;
LAB_01c06d26:
          lVar14 = (long)pbVar11 - (long)pbVar7;
          s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
          (s->br).val_ = uVar5;
          (s->br).bit_pos_ = uVar6;
          (s->br).next_in = pbVar7;
          (s->br).last_in = pbVar7 + lVar14;
          pbVar11 = pbVar7 + lVar14 + -0x1b;
          if (0xffffffffffffffe2 < lVar14 - 0x1cU) {
            pbVar11 = pbVar7;
          }
          (s->br).guard_in = pbVar11;
          goto LAB_01c06d5c;
        }
        uVar16 = (ulong)*pbVar17 << ((byte)uVar13 & 0x3f) | (s->br).val_;
        (s->br).val_ = uVar16;
        uVar13 = uVar13 + 8;
        (s->br).bit_pos_ = uVar13;
        pbVar17 = pbVar17 + 1;
        (s->br).next_in = pbVar17;
      } while (uVar13 < uVar9);
    }
    else {
      uVar16 = br->val_;
    }
    uVar5 = *(ulong *)(kBrotliBitMask + uVar9 * 8);
    (s->br).bit_pos_ = uVar13 - uVar9;
    (s->br).val_ = uVar16 >> (bVar1 & 0x3f);
    s->block_length[2] = (uVar5 & uVar16) + (ulong)uVar2;
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_40 == 0) {
      local_40 = s->block_type_rb[4];
    }
    else if (local_40 == 1) {
      local_40 = s->block_type_rb[5] + 1;
    }
    else {
      local_40 = local_40 - 2;
    }
    uVar13 = 0;
    if (uVar3 <= local_40) {
      uVar13 = uVar3;
    }
    s->block_type_rb[4] = s->block_type_rb[5];
    s->block_type_rb[5] = local_40 - uVar13;
    s->dist_context_map_slice = s->dist_context_map + (local_40 - uVar13) * 4;
    s->dist_htree_index = (s->dist_context_map + (local_40 - uVar13) * 4)[s->distance_context];
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}